

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# redblacktree.h
# Opt level: O2

void __thiscall
snmalloc::
RBTree<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_false,_false>
::insert_path(RBTree<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_false,_false>
              *this,RBPath *path,K value)

{
  bool bVar1;
  RBTree<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_false,_false>
  *pRVar2;
  ulong uVar3;
  size_t sVar4;
  ulong *puVar5;
  RBStep *pRVar6;
  ulong uVar7;
  ulong uVar8;
  uintptr_t *puVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  
  sVar4 = path->length;
  puVar9 = (path->path)._M_elems[sVar4 - 1].node.ptr.val;
  *puVar9 = (long)&((value.unsafe_capptr)->left).unsafe_capptr + (ulong)((uint)*puVar9 & 1);
  puVar5 = (ulong *)(*(path->path)._M_elems[sVar4 - 1].node.ptr.val & 0xfffffffffffffffe);
  *puVar5 = *puVar5 & 1;
  puVar5 = (ulong *)((*(path->path)._M_elems[sVar4 - 1].node.ptr.val & 0xfffffffffffffffe) + 8);
  *puVar5 = *puVar5 & 1;
  BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>
  ::set_red((Contents)value.unsafe_capptr,true);
  sVar4 = path->length;
  pRVar6 = (path->path)._M_elems + (sVar4 - 3);
  while( true ) {
    sVar4 = sVar4 - 2;
    pRVar2 = (RBTree<snmalloc::BuddyInplaceRep<snmalloc::capptr::bound<(snmalloc::capptr::dimension::Spatial)2,_(snmalloc::capptr::dimension::AddressSpaceControl)1,_(snmalloc::capptr::dimension::Wildness)1>_>,_false,_false>
              *)pRVar6[2].node.ptr.val;
    if (pRVar2 == this) {
      uVar7 = (ulong)(this->root).unsafe_capptr & 0xfffffffffffffffe;
      if ((uVar7 != 0) && ((*(ulong *)(uVar7 + 8) & 1) != 0)) {
        *(ulong *)(uVar7 + 8) = *(ulong *)(uVar7 + 8) & 0xfffffffffffffffe;
      }
      return;
    }
    uVar7 = *pRVar6[1].node.ptr.val & 0xfffffffffffffffe;
    if (uVar7 == 0) break;
    if ((*(ulong *)(uVar7 + 8) & 1) == 0) {
      return;
    }
    bVar1 = pRVar6[2].dir;
    uVar11 = (ulong)pRVar2->root & 0xfffffffffffffffe;
    uVar8 = *(pRVar6->node).ptr.val & 0xfffffffffffffffe;
    if (pRVar6[1].dir == bVar1) {
      lVar10 = (ulong)bVar1 * 8;
      uVar3 = *(ulong *)(uVar7 + lVar10);
      if ((uVar11 != 0) && ((*(ulong *)(uVar11 + 8) & 1) != 0)) {
        *(ulong *)(uVar11 + 8) = *(ulong *)(uVar11 + 8) & 0xfffffffffffffffe;
      }
      *(ulong *)(uVar8 + (ulong)(bVar1 ^ 1) * 8) =
           (ulong)((uint)*(undefined8 *)(uVar8 + (ulong)(bVar1 ^ 1) * 8) & 1) |
           uVar3 & 0xfffffffffffffffe;
      *(ulong *)(uVar7 + lVar10) = (uint)*(undefined8 *)(uVar7 + lVar10) & 1 | uVar8;
      puVar9 = (pRVar6->node).ptr.val;
      uVar12 = uVar7;
    }
    else {
      lVar13 = (ulong)(bVar1 ^ 1) * 8;
      uVar12 = *(ulong *)(uVar11 + lVar13) & 0xfffffffffffffffe;
      lVar10 = (ulong)bVar1 * 8;
      uVar3 = *(ulong *)(uVar11 + lVar10);
      *(ulong *)(uVar7 + 8) = *(ulong *)(uVar7 + 8) & 0xfffffffffffffffe;
      puVar9 = (pRVar6->node).ptr.val;
      *puVar9 = (uint)*puVar9 & 1 | uVar11;
      *(ulong *)(uVar11 + lVar13) = (uint)*(undefined8 *)(uVar11 + lVar13) & 1 | uVar8;
      *(ulong *)(uVar11 + lVar10) = (uint)*(undefined8 *)(uVar11 + lVar10) & 1 | uVar7;
      *(ulong *)(uVar7 + lVar13) =
           (ulong)((uint)*(undefined8 *)(uVar7 + lVar13) & 1) | uVar3 & 0xfffffffffffffffe;
      puVar9 = (uintptr_t *)(uVar8 + lVar10);
    }
    *puVar9 = (uint)*puVar9 & 1 | uVar12;
    path->length = sVar4;
    pRVar6 = pRVar6 + -2;
  }
  return;
}

Assistant:

void insert_path(RBPath& path, K value)
    {
      SNMALLOC_ASSERT(path.curr().is_null());
      path.curr() = value;
      get_dir(true, path.curr()) = Rep::null;
      get_dir(false, path.curr()) = Rep::null;
      Rep::set_red(value, true);

      debug_log("Insert ", path);

      // Propogate double red up to rebalance.
      // These notes were particularly clear for explaining insert
      // https://www.cs.cmu.edu/~fp/courses/15122-f10/lectures/17-rbtrees.pdf
      while (path.curr() != get_root())
      {
        SNMALLOC_ASSERT(Rep::is_red(path.curr()));
        if (!Rep::is_red(path.parent()))
        {
          invariant();
          return;
        }
        bool curr_dir = path.curr_dir();
        K curr = path.curr();
        K parent = path.parent();
        K grand_parent = path.grand_parent();
        SNMALLOC_ASSERT(!Rep::is_red(grand_parent));
        if (path.parent_dir() == curr_dir)
        {
          debug_log("Insert - double red case 1", path, path.grand_parent());
          /* Same direction case
           * G - grand parent
           * P - parent
           * C - current
           * S - sibling
           *
           *    G                 P
           *   / \               / \
           *  A   P     -->     G   C
           *     / \           / \
           *    S   C         A   S
           */
          K sibling = get_dir(!curr_dir, parent);
          Rep::set_red(curr, false);
          get_dir(curr_dir, grand_parent) = sibling;
          get_dir(!curr_dir, parent) = grand_parent;
          path.grand_parent() = parent;
          debug_log(
            "Insert - double red case 1 - done", path, path.grand_parent());
        }
        else
        {
          debug_log("Insert - double red case 2", path, path.grand_parent());
          /* G - grand parent
           * P - parent
           * C - current
           * Cg - Current child for grand parent
           * Cp - Current child for parent
           *
           *    G                  C
           *   / \               /   \
           *  A   P             G     P
           *     / \    -->    / \   / \
           *    C   B         A  Cg Cp  B
           *   / \
           *  Cg  Cp
           */
          K child_g = get_dir(curr_dir, curr);
          K child_p = get_dir(!curr_dir, curr);

          Rep::set_red(parent, false);
          path.grand_parent() = curr;
          get_dir(curr_dir, curr) = grand_parent;
          get_dir(!curr_dir, curr) = parent;
          get_dir(curr_dir, parent) = child_p;
          get_dir(!curr_dir, grand_parent) = child_g;
          debug_log(
            "Insert - double red case 2 - done", path, path.grand_parent());
        }

        // Move to what replaced grand parent.
        path.pop();
        path.pop();
        invariant(path.curr());
      }
      Rep::set_red(get_root(), false);
      invariant();
    }